

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::labelAsDisconnected(CoreBroker *this,GlobalBrokerId brkid)

{
  undefined4 in_ESI;
  anon_class_4_1_a7b45f96 unaff_retaddr;
  anon_class_4_1_a7b45f96 disconnect_procedure;
  undefined4 in_stack_fffffffffffffff8;
  
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
  apply<helics::CoreBroker::labelAsDisconnected(helics::GlobalBrokerId)::__0>
            ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),unaff_retaddr);
  gmlc::containers::
  DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>::
  apply<helics::CoreBroker::labelAsDisconnected(helics::GlobalBrokerId)::__0>
            ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),unaff_retaddr);
  return;
}

Assistant:

void CoreBroker::labelAsDisconnected(GlobalBrokerId brkid)
{
    auto disconnect_procedure = [brkid](auto& obj) {
        if (obj.parent == brkid) {
            obj.state = ConnectionState::DISCONNECTED;
        }
    };
    mBrokers.apply(disconnect_procedure);
    mFederates.apply(disconnect_procedure);
}